

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::ShaderImageLoadStoreBase::IsSSBInVSFSAvailable
          (ShaderImageLoadStoreBase *this,int required)

{
  CallLogWrapper *this_00;
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  GLint blocksFS;
  GLint blocksVS;
  ostringstream reason;
  int local_1c8;
  int local_1c4;
  string local_1c0;
  ostringstream local_1a0 [376];
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90d6,&local_1c4);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90da,&local_1c8);
  bVar1 = required <= local_1c4;
  bVar2 = required <= local_1c8;
  if (!bVar2 || !bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar3 = std::operator<<((ostream *)local_1a0,"Required ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,required);
    poVar3 = std::operator<<(poVar3," VS storage blocks but only ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c4);
    poVar3 = std::operator<<(poVar3," available.");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"Required ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,required);
    poVar3 = std::operator<<(poVar3," FS storage blocks but only ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c8);
    poVar3 = std::operator<<(poVar3," available.");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return bVar2 && bVar1;
}

Assistant:

bool IsSSBInVSFSAvailable(int required)
	{
		GLint blocksVS, blocksFS;
		glGetIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &blocksVS);
		glGetIntegerv(GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS, &blocksFS);
		if (blocksVS >= required && blocksFS >= required)
			return true;
		else
		{
			std::ostringstream reason;
			reason << "Required " << required << " VS storage blocks but only " << blocksVS << " available."
				   << std::endl
				   << "Required " << required << " FS storage blocks but only " << blocksFS << " available."
				   << std::endl;
			OutputNotSupported(reason.str());
			return false;
		}
	}